

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

cio_http_cb_return on_url(cio_http_client *arg0,char *arg1,size_t arg2)

{
  uint uVar1;
  cio_http_cb_return *pcVar2;
  cio_http_cb_return cVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar5 = (ulong)on_url_fake.call_count;
  on_url_fake.arg0_val = arg0;
  on_url_fake.arg1_val = arg1;
  on_url_fake.arg2_val = arg2;
  if (uVar5 < 0x32) {
    on_url_fake.arg0_history[uVar5] = arg0;
    on_url_fake.arg1_history[on_url_fake.call_count] = arg1;
    on_url_fake.arg2_history[on_url_fake.call_count] = arg2;
    uVar5 = (ulong)on_url_fake.call_count;
  }
  else {
    on_url_fake.arg_histories_dropped = on_url_fake.arg_histories_dropped + 1;
  }
  uVar1 = (uint)uVar5;
  on_url_fake.call_count = uVar1 + 1;
  uVar4 = (ulong)fff.call_history_idx;
  if (uVar4 < 0x32) {
    fff.call_history_idx = fff.call_history_idx + 1;
    fff.call_history[uVar4] = on_url;
  }
  pcVar2 = on_url_fake.return_val_seq;
  if ((long)on_url_fake.custom_fake_seq_len == 0) {
    if (on_url_fake.custom_fake ==
        (_func_cio_http_cb_return_cio_http_client_ptr_char_ptr_size_t *)0x0) {
      lVar6 = (long)on_url_fake.return_val_seq_len;
      if (lVar6 == 0) {
        cVar3 = on_url_fake.return_val;
        if (0x31 < uVar1) {
          return on_url_fake.return_val;
        }
      }
      else {
        lVar7 = (long)on_url_fake.return_val_seq_idx;
        if (on_url_fake.return_val_seq_idx < on_url_fake.return_val_seq_len) {
          if (uVar1 < 0x32) {
            on_url_fake.return_val_history[uVar5] = on_url_fake.return_val_seq[lVar7];
          }
          on_url_fake.return_val_seq_idx = on_url_fake.return_val_seq_idx + 1;
          return pcVar2[lVar7];
        }
        if (0x31 < uVar1) {
          return on_url_fake.return_val_seq[lVar6 + -1];
        }
        cVar3 = on_url_fake.return_val_seq[lVar6 + -1];
      }
      goto LAB_0010a208;
    }
    cVar3 = (*on_url_fake.custom_fake)(arg0,arg1,arg2);
  }
  else {
    lVar6 = (long)on_url_fake.custom_fake_seq_idx;
    if (on_url_fake.custom_fake_seq_idx < on_url_fake.custom_fake_seq_len) {
      on_url_fake.custom_fake_seq_idx = on_url_fake.custom_fake_seq_idx + 1;
      cVar3 = (*on_url_fake.custom_fake_seq[lVar6])(arg0,arg1,arg2);
    }
    else {
      cVar3 = (*on_url_fake.custom_fake_seq[(long)on_url_fake.custom_fake_seq_len + -1])
                        (arg0,arg1,arg2);
    }
  }
  if (0x31 < on_url_fake.call_count - 1) {
    return cVar3;
  }
  uVar5 = (ulong)(on_url_fake.call_count - 1);
LAB_0010a208:
  on_url_fake.return_val_history[uVar5] = cVar3;
  return cVar3;
}

Assistant:

static int on_url(http_parser *parser, const char *at, size_t length)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);

	client->http_method = (enum cio_http_method)client->parser.method;

	client->parser_settings.on_headers_complete = on_headers_complete;
	client->parser_settings.on_header_field = on_header_field_name;
	client->parser_settings.on_header_value = on_header_field_value;
	client->parser_settings.on_body = on_body;
	client->parser_settings.on_message_complete = on_message_complete;

	struct http_parser_url url;
	http_parser_url_init(&url);
	int ret = http_parser_parse_url(at, length, cio_unlikely(parser->method == (unsigned int)HTTP_CONNECT) ? 1 : 0, &url);
	if (cio_unlikely(ret != 0)) {
		return -1;
	}

	if (cio_unlikely(!path_in_url(&url))) {
		return -1;
	}

	const struct cio_http_location *location = find_location(parser->data, at + url.field_data[UF_PATH].off, url.field_data[UF_PATH].len);
	if (cio_unlikely(location == NULL)) {
		client->parser_settings.on_header_field = NULL;
		client->parser_settings.on_header_value = NULL;
		write_response(client, CIO_HTTP_STATUS_NOT_FOUND, NULL, NULL);
		return 0;
	}

	struct cio_http_location_handler *handler = location->alloc_handler(location->config);
	if (cio_unlikely(handler == NULL)) {
		handle_server_error(client, "Allocation of handler failed!");
		return 0;
	}

	if (cio_unlikely(handler->free == NULL)) {
		handle_server_error(client, "Handler has no function to free!");
		return 0;
	}

	client->current_handler = handler;

	if (cio_unlikely(cio_http_location_handler_no_callbacks(handler))) {
		handle_server_error(client, "No callbacks for given set in handler!");
		return 0;
	}

	enum cio_http_cb_return cb_ret = call_url_parts_callback(&url, UF_SCHEMA, handler->on_schema, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_HOST, handler->on_host, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PORT, handler->on_port, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PATH, handler->on_path, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_QUERY, handler->on_query, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_FRAGMENT, handler->on_fragment, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	if (handler->on_url && (!client->http_private.response_fired)) {
		return handler->on_url(client, at, length);
	}

	return 0;
}